

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_bea9::TextureWriterTestHelper<unsigned_char,_3U,_32849U>::compareTexture1Images
          (TextureWriterTestHelper<unsigned_char,_3U,_32849U> *this,ktx_uint8_t *pData)

{
  uint uVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  void *__s1;
  long lVar19;
  uint uVar20;
  size_t __n;
  bool local_a1;
  
  pvVar3 = (this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).images.
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)(this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).images.
                 super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3;
  local_a1 = lVar15 == 0;
  if (!local_a1) {
    uVar16 = (lVar15 >> 3) * -0x5555555555555555;
    uVar1 = (this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).width;
    uVar2 = (this->super_WriterTestHelper<unsigned_char,_3U,_32849U>).height;
    pvVar4 = (pvVar3->
             super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = *(pointer *)
              ((long)&(pvVar3->
                      super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      )._M_impl.super__Vector_impl_data + 8);
    uVar13 = 0;
    do {
      uVar9 = uVar1 >> ((byte)uVar13 & 0x1f);
      __n = (ulong)uVar9 * 3;
      if (uVar9 == 0) {
        __n = 3;
      }
      uVar9 = uVar2 >> ((byte)uVar13 & 0x1f);
      uVar18 = uVar9 + (uVar9 == 0);
      iVar10 = 5;
      if (pvVar5 != pvVar4) {
        uVar20 = (int)__n - 1U & 3;
        lVar19 = (uVar20 ^ 3) + __n;
        lVar15 = *(long *)&pvVar3[uVar13].
                           super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                           ._M_impl;
        uVar11 = 0;
        do {
          lVar6 = *(long *)(lVar15 + uVar11 * 0x18);
          lVar14 = *(long *)(lVar15 + 8 + uVar11 * 0x18) - lVar6;
          if (lVar14 != 0) {
            uVar17 = 0;
            do {
              __s1 = *(void **)(lVar6 + uVar17 * 0x18);
              if (uVar20 == 3) {
                iVar10 = bcmp(__s1,pData,*(long *)(lVar6 + uVar17 * 0x18 + 8) - (long)__s1);
                if (iVar10 != 0) {
                  iVar10 = 1;
                  goto LAB_0012ea63;
                }
                pData = pData + (ulong)uVar18 * lVar19;
              }
              else {
                iVar10 = bcmp(__s1,pData,__n);
                if (iVar10 == 0) {
                  uVar8 = 1;
                  do {
                    uVar12 = uVar8;
                    pData = pData + lVar19;
                    __s1 = (void *)((long)__s1 + __n);
                    if (uVar18 == uVar12) {
                      iVar10 = 0;
                      goto LAB_0012ea38;
                    }
                    iVar10 = bcmp(__s1,pData,__n);
                    uVar8 = uVar12 + 1;
                  } while (iVar10 == 0);
                  iVar10 = 1;
LAB_0012ea38:
                  bVar7 = uVar12 < uVar9;
                }
                else {
                  iVar10 = 1;
                  bVar7 = true;
                }
                if (bVar7) goto LAB_0012ea63;
              }
              uVar17 = (ulong)((int)uVar17 + 1);
            } while (uVar17 < (ulong)((lVar14 >> 3) * -0x5555555555555555));
          }
          iVar10 = 8;
LAB_0012ea63:
          if (iVar10 != 8) goto LAB_0012eaa0;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (uVar11 < (ulong)(((long)pvVar5 - (long)pvVar4 >> 3) * -0x5555555555555555));
        iVar10 = 5;
      }
LAB_0012eaa0:
      if ((iVar10 != 5) && (iVar10 != 0)) {
        return local_a1;
      }
      uVar13 = (ulong)((int)uVar13 + 1);
      local_a1 = uVar16 <= uVar13;
    } while (uVar13 < uVar16);
  }
  return local_a1;
}

Assistant:

bool
    compareTexture1Images(ktx_uint8_t* pData)
    {
        for (ktx_uint32_t level = 0; level < images.size(); level++) {
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_size_t rowBytes = levelWidth * sizeof(component_type) * numComponents;
            ktx_uint32_t rowPadding = ROUNDING(rowBytes);
            ktx_size_t paddedImageBytes = (rowBytes + rowPadding) * levelHeight;
            for (ktx_uint32_t layer = 0; layer < images[0].size(); layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < images[level][layer].size(); faceSlice++) {
                    if (rowPadding == 0) {
                        if (memcmp(images[level][layer][faceSlice].data(), pData,
                                   images[level][layer][faceSlice].size() * sizeof(component_type)))
                            return false;
                        pData += paddedImageBytes;
                    } else {
                        ktx_uint8_t* pImage = (ktx_uint8_t*)images[level][layer][faceSlice].data();
                        for (ktx_uint32_t row = 0; row < levelHeight; row++) {
                            if (memcmp(pImage, pData, rowBytes))
                                return false;
                            pImage += rowBytes;
                            pData += rowBytes + rowPadding;
                        }
                    }
                }
            }
        }
        return true;
    }